

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int parse_num(Context_conflict *ctx,int floatok,uint32 *value)

{
  Token TVar1;
  Token TVar2;
  float extraout_EAX;
  float fVar3;
  char *pcVar4;
  int d;
  float local_30;
  float local_2c;
  
  TVar1 = nexttoken(ctx);
  TVar2 = TVar1;
  if (TVar1 == 0x2d) {
    TVar2 = nexttoken(ctx);
  }
  if (TVar2 == TOKEN_FLOAT_LITERAL) {
    if (floatok != 0) {
      local_2c = (float)__isoc99_sscanf(ctx->token,"%f",&local_30);
      if (TVar1 == 0x2d) {
        local_30 = -local_30;
      }
      goto LAB_001248fb;
    }
    pcVar4 = "Expected whole number";
  }
  else {
    if (TVar2 == TOKEN_INT_LITERAL) {
      local_2c = 0.0;
      __isoc99_sscanf(ctx->token,"%d",&local_2c);
      fVar3 = (float)-(int)local_2c;
      if (TVar1 != 0x2d) {
        fVar3 = local_2c;
      }
      local_30 = (float)(int)fVar3;
      if (floatok == 0) {
        local_30 = fVar3;
      }
      goto LAB_001248fb;
    }
    pcVar4 = "Expected number";
  }
  failf(ctx,"%s",pcVar4);
  local_30 = 0.0;
  local_2c = extraout_EAX;
LAB_001248fb:
  *value = (uint32)local_30;
  return (int)local_2c;
}

Assistant:

static int parse_num(Context *ctx, const int floatok, uint32 *value)
{
    union { float f; int32 si32; uint32 ui32; } cvt;
    int negative = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '-'))
    {
        negative = 1;
        token = nexttoken(ctx);
    } // if

    if (token == TOKEN_INT_LITERAL)
    {
        int d = 0;
        sscanf(ctx->token, "%d", &d);
        if (floatok)
            cvt.f = (float) ((negative) ? -d : d);
        else
            cvt.si32 = (int32) ((negative) ? -d : d);
    } // if
    else if (token == TOKEN_FLOAT_LITERAL)
    {
        if (!floatok)
        {
            fail(ctx, "Expected whole number");
            *value = 0;
            return 0;
        } // if
        sscanf(ctx->token, "%f", &cvt.f);
        if (negative)
            cvt.f = -cvt.f;
    } // if
    else
    {
        fail(ctx, "Expected number");
        *value = 0;
        return 0;
    } // else

    *value = cvt.ui32;
    return 1;
}